

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Queries::FunctionalTest::checkQueryBufferObject<long>
          (FunctionalTest *this,GLuint query,GLenum pname,long expected_value,
          _func_bool_long_long *comparison)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  long *plVar6;
  long *value;
  bool is_ok;
  Functions *gl;
  _func_bool_long_long *comparison_local;
  long expected_value_local;
  GLenum pname_local;
  GLuint query_local;
  FunctionalTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  GetQueryBufferObject<long>(this,query,this->m_bo_query,pname,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGetQueryBufferObject* have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x5a7);
  plVar6 = (long *)(**(code **)(lVar5 + 0xcf8))(0x9192,35000);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glMapBuffer have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x5ab);
  bVar1 = (*comparison)(expected_value,*plVar6);
  (**(code **)(lVar5 + 0x1670))(0x9192);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glUnmapBuffer have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x5b5);
  return bVar1;
}

Assistant:

bool FunctionalTest::checkQueryBufferObject(glw::GLuint query, glw::GLenum pname, T expected_value,
											bool (*comparison)(T, T))
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Default result. */
	bool is_ok = true;

	/* Saving results to buffer. */
	GetQueryBufferObject<T>(query, m_bo_query, pname, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryBufferObject* have failed");

	/* Mapping buffer to user space. */
	T* value = (T*)gl.mapBuffer(GL_QUERY_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer have failed");

	/* Doing test. */
	if (!comparison(expected_value, *value))
	{
		is_ok = false;
	}

	/* Cleanup. */
	gl.unmapBuffer(GL_QUERY_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer have failed");

	/* Return test result. */
	return is_ok;
}